

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg3.hpp
# Opt level: O3

basic_istream<char,_std::char_traits<char>_> *
trng::operator>>(basic_istream<char,_std::char_traits<char>_> *in,mrg3 *R)

{
  basic_istream<char,_std::char_traits<char>_> *pbVar1;
  long lVar2;
  parameter_type P_new;
  status_type S_new;
  delim_c local_58;
  delim_c local_57;
  delim_c local_56;
  delim_c local_55;
  undefined4 local_54;
  delim_str local_50;
  mrg_parameter<int,_3,_trng::mrg3> local_48;
  mrg_status<int,_3,_trng::mrg3> local_3c;
  
  local_48.a[2] = 0;
  local_48.a[0] = 0;
  local_48.a[1] = 0;
  local_3c.r[0] = 0;
  local_3c.r[1] = 1;
  local_3c.r[2] = 1;
  local_54 = *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18);
  *(undefined4 *)(in + *(long *)(*(long *)in + -0x18) + 0x18) = 0x26;
  utility::operator>>(in,(ignore_spaces_cl *)&local_50);
  local_55.c = '[';
  pbVar1 = utility::operator>>(in,&local_55);
  local_50.str = mrg3::name();
  pbVar1 = utility::operator>>(pbVar1,&local_50);
  local_56.c = ' ';
  pbVar1 = utility::operator>>(pbVar1,&local_56);
  pbVar1 = operator>>(pbVar1,&local_48);
  local_57.c = ' ';
  pbVar1 = utility::operator>>(pbVar1,&local_57);
  pbVar1 = operator>>(pbVar1,&local_3c);
  local_58.c = ']';
  utility::operator>>(pbVar1,&local_58);
  lVar2 = *(long *)(*(long *)in + -0x18);
  if (((byte)in[lVar2 + 0x20] & 5) == 0) {
    (R->P).a[2] = local_48.a[2];
    *(undefined8 *)(R->P).a = local_48.a._0_8_;
    (R->S).r[2] = local_3c.r[2];
    *(undefined8 *)(R->S).r = local_3c.r._0_8_;
    lVar2 = *(long *)(*(long *)in + -0x18);
  }
  *(undefined4 *)(in + lVar2 + 0x18) = local_54;
  return in;
}

Assistant:

std::basic_istream<char_t, traits_t> &operator>>(
        std::basic_istream<char_t, traits_t> &in, mrg3 &R) {
      mrg3::parameter_type P_new;
      mrg3::status_type S_new;
      std::ios_base::fmtflags flags(in.flags());
      in.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
      in >> utility::ignore_spaces();
      in >> utility::delim('[') >> utility::delim(mrg3::name()) >> utility::delim(' ') >>
          P_new >> utility::delim(' ') >> S_new >> utility::delim(']');
      if (in) {
        R.P = P_new;
        R.S = S_new;
      }
      in.flags(flags);
      return in;
    }